

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqmodules.cpp
# Opt level: O1

bool __thiscall
SqModules::reloadModule
          (SqModules *this,char *fn,bool must_exist,char *__name__,Object *exports,
          string *out_err_msg)

{
  pointer pMVar1;
  pointer __pos;
  pointer pMVar2;
  pointer pMVar3;
  pointer pMVar4;
  pointer pMVar5;
  bool bVar6;
  string errMsg;
  
  pMVar1 = (this->modules).super__Vector_base<SqModules::Module,_std::allocator<SqModules::Module>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __pos = (this->prevModules).
          super__Vector_base<SqModules::Module,_std::allocator<SqModules::Module>_>._M_impl.
          super__Vector_impl_data._M_start;
  pMVar2 = (this->prevModules).
           super__Vector_base<SqModules::Module,_std::allocator<SqModules::Module>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pMVar3 = (this->prevModules).
           super__Vector_base<SqModules::Module,_std::allocator<SqModules::Module>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pMVar4 = (this->modules).super__Vector_base<SqModules::Module,_std::allocator<SqModules::Module>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar5 = (this->modules).super__Vector_base<SqModules::Module,_std::allocator<SqModules::Module>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->modules).super__Vector_base<SqModules::Module,_std::allocator<SqModules::Module>_>._M_impl.
  super__Vector_impl_data._M_start = __pos;
  (this->modules).super__Vector_base<SqModules::Module,_std::allocator<SqModules::Module>_>._M_impl.
  super__Vector_impl_data._M_finish = pMVar2;
  (this->modules).super__Vector_base<SqModules::Module,_std::allocator<SqModules::Module>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pMVar3;
  (this->prevModules).super__Vector_base<SqModules::Module,_std::allocator<SqModules::Module>_>.
  _M_impl.super__Vector_impl_data._M_start = pMVar4;
  (this->prevModules).super__Vector_base<SqModules::Module,_std::allocator<SqModules::Module>_>.
  _M_impl.super__Vector_impl_data._M_finish = pMVar5;
  (this->prevModules).super__Vector_base<SqModules::Module,_std::allocator<SqModules::Module>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pMVar1;
  std::vector<SqModules::Module,_std::allocator<SqModules::Module>_>::_M_erase_at_end
            (&this->modules,__pos);
  bVar6 = requireModule(this,fn,must_exist,__name__,exports,out_err_msg);
  std::vector<SqModules::Module,_std::allocator<SqModules::Module>_>::_M_erase_at_end
            (&this->prevModules,
             (this->prevModules).
             super__Vector_base<SqModules::Module,_std::allocator<SqModules::Module>_>._M_impl.
             super__Vector_impl_data._M_start);
  return bVar6;
}

Assistant:

bool SqModules::reloadModule(const char *fn, bool must_exist, const char *__name__, Sqrat::Object &exports, string &out_err_msg)
{
  SQRAT_ASSERT(prevModules.empty());

  modules.swap(prevModules);
  modules.clear(); // just in case

  string errMsg;
  bool res = requireModule(fn, must_exist, __name__, exports, out_err_msg);

  prevModules.clear();

  return res;
}